

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jama_lu.h
# Opt level: O0

Array2D<double> * __thiscall
JAMA::LU<double>::solve(Array2D<double> *__return_storage_ptr__,LU<double> *this,Array2D<double> *B)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  int local_44;
  int local_40;
  int j_2;
  int i_1;
  int j_1;
  int k_1;
  int j;
  int i;
  int k;
  int nx;
  Array2D<double> *B_local;
  LU<double> *this_local;
  Array2D<double> *X;
  
  iVar3 = TNT::Array2D<double>::dim1(B);
  if (iVar3 == this->m) {
    iVar3 = isNonsingular(this);
    if (iVar3 == 0) {
      TNT::Array2D<double>::Array2D(__return_storage_ptr__,0,0);
    }
    else {
      iVar3 = TNT::Array2D<double>::dim2(B);
      permute_copy(__return_storage_ptr__,this,B,&this->piv,0,iVar3 + -1);
      for (j = 0; k_1 = j, j < this->n; j = j + 1) {
        while (k_1 = k_1 + 1, k_1 < this->n) {
          for (j_1 = 0; j_1 < iVar3; j_1 = j_1 + 1) {
            pdVar4 = TNT::Array2D<double>::operator[](__return_storage_ptr__,j);
            dVar1 = pdVar4[j_1];
            pdVar4 = TNT::Array2D<double>::operator[](&this->LU_,k_1);
            dVar2 = pdVar4[j];
            pdVar4 = TNT::Array2D<double>::operator[](__return_storage_ptr__,k_1);
            pdVar4[j_1] = -dVar1 * dVar2 + pdVar4[j_1];
          }
        }
      }
      i_1 = this->n;
      while (i_1 = i_1 + -1, -1 < i_1) {
        for (j_2 = 0; j_2 < iVar3; j_2 = j_2 + 1) {
          pdVar4 = TNT::Array2D<double>::operator[](&this->LU_,i_1);
          dVar1 = pdVar4[i_1];
          pdVar4 = TNT::Array2D<double>::operator[](__return_storage_ptr__,i_1);
          pdVar4[j_2] = pdVar4[j_2] / dVar1;
        }
        for (local_40 = 0; local_40 < i_1; local_40 = local_40 + 1) {
          for (local_44 = 0; local_44 < iVar3; local_44 = local_44 + 1) {
            pdVar4 = TNT::Array2D<double>::operator[](__return_storage_ptr__,i_1);
            dVar1 = pdVar4[local_44];
            pdVar4 = TNT::Array2D<double>::operator[](&this->LU_,local_40);
            dVar2 = pdVar4[i_1];
            pdVar4 = TNT::Array2D<double>::operator[](__return_storage_ptr__,local_40);
            pdVar4[local_44] = -dVar1 * dVar2 + pdVar4[local_44];
          }
        }
      }
    }
  }
  else {
    TNT::Array2D<double>::Array2D(__return_storage_ptr__,0,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<Real> solve (const Array2D<Real> &B) 
   {

	  /* Dimensions: A is mxn, X is nxk, B is mxk */
      
      if (B.dim1() != m) {
	  	return Array2D<Real>(0,0);
      }
      if (!isNonsingular()) {
        return Array2D<Real>(0,0);
      }

      // Copy right hand side with pivoting
      int nx = B.dim2();


	  Array2D<Real> X = permute_copy(B, piv, 0, nx-1);

      // Solve L*Y = B(piv,:)
      for (int k = 0; k < n; k++) {
         for (int i = k+1; i < n; i++) {
            for (int j = 0; j < nx; j++) {
               X[i][j] -= X[k][j]*LU_[i][k];
            }
         }
      }
      // Solve U*X = Y;
      for (int k = n-1; k >= 0; k--) {
         for (int j = 0; j < nx; j++) {
            X[k][j] /= LU_[k][k];
         }
         for (int i = 0; i < k; i++) {
            for (int j = 0; j < nx; j++) {
               X[i][j] -= X[k][j]*LU_[i][k];
            }
         }
      }
      return X;
   }